

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2connection.cpp
# Opt level: O1

QHttp2Stream * __thiscall QHttp2Connection::getStream(QHttp2Connection *this,quint32 streamID)

{
  QHttp2Stream *pQVar1;
  long in_FS_OFFSET;
  QHash<unsigned_int,_QPointer<QHttp2Stream>_> local_28;
  QHttp2Stream *local_20;
  quint32 local_14;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_14 = streamID;
  QHash<unsigned_int,_QPointer<QHttp2Stream>_>::value
            (&local_28,(uint *)(this + 0x1c0),(QPointer<QHttp2Stream> *)&local_14);
  if ((local_28.d == (Data *)0x0) || (pQVar1 = local_20, *(int *)&(local_28.d)->field_0x4 == 0)) {
    pQVar1 = (QHttp2Stream *)0x0;
  }
  if (local_28.d != (Data *)0x0) {
    LOCK();
    ((local_28.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
         ((local_28.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((local_28.d)->ref).atomic._q_value.super___atomic_base<int>._M_i == 0) &&
       (local_28.d != (Data *)0x0)) {
      operator_delete(local_28.d);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return pQVar1;
  }
  __stack_chk_fail();
}

Assistant:

QHttp2Stream *QHttp2Connection::getStream(quint32 streamID) const
{
    return m_streams.value(streamID, nullptr).get();
}